

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

fileMetrics *
exrmetrics(fileMetrics *__return_storage_ptr__,char *inFileName,char *outFileName,int part,
          Compression compression,float level,int passes,bool write,bool reread,PixelMode pixelMode,
          bool verbose)

{
  string *__rhs;
  long *plVar1;
  uint64_t *puVar2;
  bool *pbVar3;
  undefined1 uVar4;
  pointer ppVar5;
  uint64_t uVar6;
  pointer pHVar7;
  pointer pHVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  _Rb_tree_color _Var14;
  int iVar15;
  ostream *poVar16;
  Header *pHVar17;
  Compression *pCVar18;
  int *piVar19;
  float *pfVar20;
  _Rb_tree_node_base *p_Var21;
  _Rb_tree_node_base *p_Var22;
  char *pcVar23;
  MultiPartOutputFile *this;
  MultiPartInputFile *this_00;
  runtime_error *prVar24;
  size_t i;
  long lVar25;
  ulong uVar26;
  int p;
  long lVar27;
  uint64_t local_248;
  allocator<char> local_22d;
  float local_22c;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> outHeaders;
  vector<partData,_std::allocator<partData>_> parts;
  MultiPartInputFile in;
  stat instats;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat outstats;
  
  local_22c = level;
  if (verbose) {
    poVar16 = std::operator<<((ostream *)&std::cerr,"read ");
    std::operator<<(poVar16,inFileName);
    poVar16 = std::operator<<((ostream *)&std::cerr," as ");
    modeName_abi_cxx11_((string *)&instats,pixelMode);
    poVar16 = std::operator<<(poVar16,(string *)&instats);
    std::operator<<(poVar16,"... ");
    std::__cxx11::string::~string((string *)&instats);
    std::ostream::flush();
  }
  iVar11 = Imf_3_4::globalThreadCount();
  iVar12 = 1;
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&in,inFileName,iVar11,true);
  if ((part != -1) && (iVar11 = Imf_3_4::MultiPartInputFile::parts(), iVar11 <= part)) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,inFileName,&local_22d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                   &local_e0," only contains ");
    iVar11 = Imf_3_4::MultiPartInputFile::parts();
    std::__cxx11::to_string(&local_100,iVar11);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outHeaders,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parts,
                   &local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstats,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outHeaders,
                   " parts. Cannot copy part ");
    std::__cxx11::to_string(&local_120,part);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instats,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstats,
                   &local_120);
    std::runtime_error::runtime_error(prVar24,(char *)instats.st_dev);
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fileMetrics::fileMetrics(__return_storage_ptr__);
  if (part == -1) {
    iVar12 = Imf_3_4::MultiPartInputFile::parts();
  }
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            (&outHeaders,(long)iVar12,(allocator_type *)&instats);
  if (part == -1) {
    lVar25 = 0;
    for (lVar27 = 0; iVar11 = Imf_3_4::MultiPartInputFile::parts(), lVar27 < iVar11;
        lVar27 = lVar27 + 1) {
      pHVar17 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&in);
      Imf_3_4::Header::operator=
                (outHeaders.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar25,pHVar17);
      lVar25 = lVar25 + 0x38;
    }
  }
  else {
    pHVar17 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&in);
    Imf_3_4::Header::operator=
              (outHeaders.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start,pHVar17);
  }
  fVar13 = ABS(local_22c);
  bVar10 = -1.0 <= local_22c;
  iVar11 = (int)local_22c;
  lVar25 = 0;
  bVar9 = false;
  do {
    iVar12 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar12 <= lVar25) {
      if ((bVar10 && fVar13 != INFINITY) && !bVar9) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar24,"-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
        __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (part == -1) {
        iVar11 = Imf_3_4::MultiPartInputFile::parts();
      }
      else {
        iVar11 = 1;
      }
      std::vector<partData,_std::allocator<partData>_>::vector
                (&parts,(long)iVar11,(allocator_type *)&instats);
      std::vector<partStats,_std::allocator<partStats>_>::resize
                (&__return_storage_ptr__->stats,
                 ((long)parts.super__Vector_base<partData,_std::allocator<partData>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)parts.super__Vector_base<partData,_std::allocator<partData>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x250);
      initAndReadFile(&in,&outHeaders,part,&parts,__return_storage_ptr__,reread);
      if (write) {
        if (outFileName == (char *)0x0) {
          DummyOStream::DummyOStream((DummyOStream *)&instats);
          pHVar8 = outHeaders.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pHVar7 = outHeaders.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar11 = Imf_3_4::globalThreadCount();
          Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                    ((MultiPartOutputFile *)&outstats,(OStream *)&instats,pHVar7,
                     (int)(((long)pHVar8 - (long)pHVar7) / 0x38),false,iVar11);
          writeFile((MultiPartOutputFile *)&outstats,&parts,__return_storage_ptr__,false);
          local_248 = instats.st_rdev;
          Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&outstats);
          Imf_3_4::OStream::~OStream((OStream *)&instats);
        }
        else {
          local_248 = 0;
        }
        if (verbose) {
          std::operator<<((ostream *)&std::cerr," write ");
          if (compression != NUM_COMPRESSION_METHODS) {
            instats.st_dev = (__dev_t)&instats.st_nlink;
            instats.st_ino = 0;
            instats.st_nlink._0_1_ = 0;
            Imf_3_4::getCompressionNameFromId(compression,(string *)&instats);
            poVar16 = std::operator<<((ostream *)&std::cerr,"compression ");
            std::operator<<(poVar16,(string *)&instats);
            std::__cxx11::string::~string((string *)&instats);
          }
          std::operator<<((ostream *)&std::cerr,"... ");
          std::ostream::flush();
        }
        iVar12 = 0;
        iVar11 = passes;
        if (passes < 1) {
          iVar11 = iVar12;
        }
        for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
          if (1 < passes && verbose) {
            poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,iVar12);
            std::operator<<(poVar16,' ');
            std::ostream::flush();
          }
          MemOStream::MemOStream((MemOStream *)&instats,local_248);
          if (outFileName == (char *)0x0) {
            this = (MultiPartOutputFile *)operator_new(0x10);
            pHVar8 = outHeaders.
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pHVar7 = outHeaders.
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = Imf_3_4::globalThreadCount();
            Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                      (this,(OStream *)&instats,pHVar7,(int)(((long)pHVar8 - (long)pHVar7) / 0x38),
                       false,iVar15);
          }
          else {
            this = (MultiPartOutputFile *)operator_new(0x10);
            pHVar8 = outHeaders.
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pHVar7 = outHeaders.
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = Imf_3_4::globalThreadCount();
            Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                      (this,outFileName,pHVar7,(int)(((long)pHVar8 - (long)pHVar7) / 0x38),false,
                       iVar15);
          }
          writeFile(this,&parts,__return_storage_ptr__,true);
          (**(code **)(*(long *)this + 8))(this);
          if (reread) {
            MemIStream::MemIStream((MemIStream *)&outstats,(MemOStream *)&instats);
            if (outFileName == (char *)0x0) {
              this_00 = (MultiPartInputFile *)operator_new(0x20);
              iVar15 = Imf_3_4::globalThreadCount();
              Imf_3_4::MultiPartInputFile::MultiPartInputFile
                        (this_00,(IStream *)&outstats,iVar15,true);
            }
            else {
              this_00 = (MultiPartInputFile *)operator_new(0x20);
              iVar15 = Imf_3_4::globalThreadCount();
              Imf_3_4::MultiPartInputFile::MultiPartInputFile(this_00,outFileName,iVar15,true);
            }
            rereadFile(this_00,&parts,__return_storage_ptr__);
            Imf_3_4::MultiPartInputFile::~MultiPartInputFile(this_00);
            operator_delete(this_00,0x20);
            Imf_3_4::IStream::~IStream((IStream *)&outstats);
          }
          MemOStream::~MemOStream((MemOStream *)&instats);
        }
        stat(inFileName,(stat *)&instats);
        __return_storage_ptr__->inputFileSize = instats.st_size;
        if (outFileName != (char *)0x0) {
          stat(outFileName,(stat *)&outstats);
          local_248 = outstats.st_size;
        }
        __return_storage_ptr__->outputFileSize = local_248;
      }
      partStats::operator=
                (&__return_storage_ptr__->totalStats,
                 (__return_storage_ptr__->stats).
                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start);
      __rhs = &(__return_storage_ptr__->totalStats).sizeData.partType;
      lVar25 = 0x160;
      for (uVar26 = 1;
          ppVar5 = (__return_storage_ptr__->stats).
                   super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar26 < (ulong)(((long)(__return_storage_ptr__->stats).
                                  super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)ppVar5) / 0xc0);
          uVar26 = uVar26 + 1) {
        accumulate(&(__return_storage_ptr__->totalStats).readPerf,
                   (vector<double,_std::allocator<double>_> *)((long)ppVar5 + lVar25 + -0x88));
        accumulate(&(__return_storage_ptr__->totalStats).countReadPerf,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)(__return_storage_ptr__->stats).
                          super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar25 + -0xa0));
        accumulate(&(__return_storage_ptr__->totalStats).writePerf,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)(__return_storage_ptr__->stats).
                          super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar25 + -0x70));
        accumulate(&(__return_storage_ptr__->totalStats).rereadPerf,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)(__return_storage_ptr__->stats).
                          super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar25 + -0x40));
        accumulate(&(__return_storage_ptr__->totalStats).countRereadPerf,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)(__return_storage_ptr__->stats).
                          super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar25 + -0x58));
        ppVar5 = (__return_storage_ptr__->stats).
                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar2 = &(__return_storage_ptr__->totalStats).sizeData.channelCount;
        *puVar2 = *puVar2 + *(long *)((long)ppVar5 + lVar25 + -0x18);
        plVar1 = (long *)((long)ppVar5 + lVar25 + -0x28);
        lVar27 = plVar1[1];
        uVar6 = (__return_storage_ptr__->totalStats).sizeData.pixelCount;
        (__return_storage_ptr__->totalStats).sizeData.rawSize =
             (__return_storage_ptr__->totalStats).sizeData.rawSize + *plVar1;
        (__return_storage_ptr__->totalStats).sizeData.pixelCount = uVar6 + lVar27;
        puVar2 = &(__return_storage_ptr__->totalStats).sizeData.tileCount;
        *puVar2 = *puVar2 + *(long *)((long)ppVar5 + lVar25 + -0x10);
        pbVar3 = &(__return_storage_ptr__->totalStats).sizeData.isDeep;
        *pbVar3 = (bool)(*pbVar3 | *(byte *)((long)ppVar5 + lVar25 + -8));
        pbVar3 = &(__return_storage_ptr__->totalStats).sizeData.isTiled;
        *pbVar3 = (bool)(*pbVar3 | *(byte *)((long)ppVar5 + lVar25 + -7));
        if (*(Compression *)((long)ppVar5 + lVar25 + -4) !=
            (__return_storage_ptr__->totalStats).sizeData.compression) {
          (__return_storage_ptr__->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
        }
        bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&(ppVar5->countReadPerf).
                                            super__Vector_base<double,_std::allocator<double>_> +
                                    lVar25),__rhs);
        if (bVar10) {
          std::__cxx11::string::assign((char *)__rhs);
        }
        lVar25 = lVar25 + 0xc0;
      }
      if (verbose) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      std::vector<partData,_std::allocator<partData>_>::~vector(&parts);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&outHeaders);
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&in);
      return __return_storage_ptr__;
    }
    if ((int)compression < 10) {
      pCVar18 = (Compression *)Imf_3_4::Header::compression();
      *pCVar18 = compression;
    }
    if (bVar10 && fVar13 != INFINITY) {
      piVar19 = (int *)Imf_3_4::Header::compression();
      if (*piVar19 - 2U < 2) {
        piVar19 = (int *)Imf_3_4::Header::zipCompressionLevel();
        *piVar19 = iVar11;
      }
      else {
        if (1 < *piVar19 - 8U) goto LAB_0010b74e;
        pfVar20 = (float *)Imf_3_4::Header::dwaCompressionLevel();
        *pfVar20 = local_22c;
      }
      bVar9 = true;
    }
LAB_0010b74e:
    if (pixelMode != PIXELMODE_ORIGINAL) {
      Imf_3_4::Header::channels();
      p_Var21 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      while( true ) {
        Imf_3_4::Header::channels();
        p_Var22 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        if (p_Var21 == p_Var22) break;
        pcVar23 = strrchr((char *)(p_Var21 + 1),0x72);
        p_Var22 = (_Rb_tree_node_base *)(pcVar23 + 1);
        if (pcVar23 == (char *)0x0) {
          p_Var22 = p_Var21 + 1;
        }
        _Var14 = pixelMode;
        if (pixelMode == PIXELMODE_ALL_HALF) {
LAB_0010b7e7:
          p_Var21[9]._M_color = _Var14;
        }
        else {
          if (pixelMode == PIXELMODE_MIXED_HALF_FLOAT) {
            uVar4 = (undefined1)p_Var22->_M_color;
            if (((((uVar4 != 0x41) && (uVar4 != 0x42)) && (uVar4 != 0x47)) && (uVar4 != 0x52)) ||
               (_Var14 = _S_black, *(byte *)((long)&p_Var22->_M_color + 1) != 0)) goto LAB_0010b7e4;
            goto LAB_0010b7e7;
          }
          if ((pixelMode & ~PIXELMODE_ALL_HALF) == PIXELMODE_ALL_FLOAT) {
LAB_0010b7e4:
            _Var14 = 2;
            goto LAB_0010b7e7;
          }
        }
        p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
      }
    }
    lVar25 = lVar25 + 1;
  } while( true );
}

Assistant:

fileMetrics
exrmetrics (
    const char*                        inFileName,
    const char*                        outFileName,
    int                                part,
    OPENEXR_IMF_NAMESPACE::Compression compression,
    float                              level,
    int                                passes,
    bool                               write,
    bool                               reread,
    PixelMode                          pixelMode,
    bool                               verbose)
{

    if (verbose)
    {
        cerr << "read " << inFileName;
        cerr << " as " << modeName (pixelMode) << "... ";
        cerr.flush ();
    }

    MultiPartInputFile in (inFileName);
    if (part != -1 && part >= in.parts ())
    {
        throw runtime_error ((string (inFileName) + " only contains " +
                              to_string (in.parts ()) +
                              " parts. Cannot copy part " + to_string (part))
                                 .c_str ());
    }
    fileMetrics metrics;

    //write all parts if part==-1, otherwise write single part specified
    vector<Header> outHeaders (part == -1 ? in.parts () : 1);
    if (part == -1)
    {
        for (int p = 0; p < in.parts (); ++p)
        {
            outHeaders[p] = in.header (p);
        }
    }
    else { outHeaders[0] = in.header (part); }

    bool compressionSet = false;

    for (int p = 0; p < in.parts (); ++p)
    {
        if (compression < NUM_COMPRESSION_METHODS)
        {
            outHeaders[p].compression () = compression;
        }

        if (!isinf (level) && level >= -1)
        {
            switch (outHeaders[p].compression ())
            {
                case DWAA_COMPRESSION:
                case DWAB_COMPRESSION:
                    outHeaders[p].dwaCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                case ZIP_COMPRESSION:
                case ZIPS_COMPRESSION:
                    outHeaders[p].zipCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                    //            case ZSTD_COMPRESSION :
                    //                outHeader.zstdCompressionLevel()=level;
                    //                break;
                default: break;
            }
        }

        if (pixelMode != PIXELMODE_ORIGINAL)
        {
            for (ChannelList::Iterator i = outHeaders[p].channels ().begin ();
                 i != outHeaders[p].channels ().end ();
                 ++i)
            {
                // find channel suffix within full channel name (so 'R' in 'layer.R')
                const char* name = i.name ();
                const char* dot  = strrchr (name, 'r');
                if (dot) { name = dot + 1; }

                if (pixelMode == PIXELMODE_ALL_HALF ||
                    (pixelMode == PIXELMODE_MIXED_HALF_FLOAT &&
                     (!strcmp (name, "R") || !strcmp (name, "G") ||
                      !strcmp (name, "B") || !strcmp (name, "A"))))
                {
                    i.channel ().type = HALF;
                }
                else if (
                    pixelMode == PIXELMODE_ALL_FLOAT ||
                    pixelMode == PIXELMODE_MIXED_HALF_FLOAT)
                {
                    i.channel ().type = FLOAT;
                }
            }
        }
    }

    // abort if level was set but no parts had a compression type with a level
    if (!isinf (level) && level >= -1 && !compressionSet)
    {
        throw runtime_error (
            "-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    }

    vector<partData> parts (part == -1 ? in.parts () : 1);
    metrics.stats.resize (parts.size ());

    initAndReadFile (in, outHeaders, part, parts, metrics, reread);

    if (write)
    {

        //
        // when NOT writing to file, write to preallocated block of data
        // precompute the total datasize, so no memory reallocation is required
        //
        uint64_t fileSize = 0;
        if (!outFileName)
        {

            DummyOStream        tmp;
            MultiPartOutputFile out (
                tmp, outHeaders.data (), outHeaders.size ());
            writeFile (out, parts, metrics, false);
            fileSize = tmp.tellp ();
        }

        //
        // write to output; re-read output back to input
        //

        if (verbose)
        {
            cerr << " write ";
            if (compression != NUM_COMPRESSION_METHODS)
            {
                string name;
                getCompressionNameFromId (compression, name);
                cerr << "compression " << name;
            }
            cerr << "... ";
            cerr.flush ();
        }

        for (int i = 0; i < passes; ++i)
        {
            if (verbose && passes > 1)
            {
                cerr << i << ' ';
                cerr.flush ();
            }
            MemOStream           ostream (fileSize);
            MultiPartOutputFile* out;
            if (outFileName)
            {
                out = new MultiPartOutputFile (
                    outFileName, outHeaders.data (), outHeaders.size ());
            }
            else
            {
                out = new MultiPartOutputFile (
                    ostream, outHeaders.data (), outHeaders.size ());
            }
            writeFile (*out, parts, metrics, true);
            delete out;

            if (reread)
            {
                MemIStream          istream (ostream);
                MultiPartInputFile* in;
                if (outFileName) { in = new MultiPartInputFile (outFileName); }
                else { in = new MultiPartInputFile (istream); }

                rereadFile (*in, parts, metrics);

                delete in;
            }
        }

        struct stat instats, outstats;
        stat (inFileName, &instats);
        metrics.inputFileSize = instats.st_size;
        if (outFileName)
        {
            stat (outFileName, &outstats);
            metrics.outputFileSize = outstats.st_size;
        }
        else { metrics.outputFileSize = fileSize; }
    }

    //
    // sum across all parts
    //

    metrics.totalStats = metrics.stats[0];
    for (size_t i = 1; i < metrics.stats.size (); ++i)
    {
        accumulate (metrics.totalStats.readPerf, metrics.stats[i].readPerf);
        accumulate (
            metrics.totalStats.countReadPerf, metrics.stats[i].countReadPerf);
        accumulate (metrics.totalStats.writePerf, metrics.stats[i].writePerf);
        accumulate (metrics.totalStats.rereadPerf, metrics.stats[i].rereadPerf);
        accumulate (
            metrics.totalStats.countRereadPerf,
            metrics.stats[i].countRereadPerf);

        metrics.totalStats.sizeData.pixelCount +=
            metrics.stats[i].sizeData.pixelCount;
        metrics.totalStats.sizeData.channelCount +=
            metrics.stats[i].sizeData.channelCount;
        metrics.totalStats.sizeData.rawSize +=
            metrics.stats[i].sizeData.rawSize;
        metrics.totalStats.sizeData.tileCount +=
            metrics.stats[i].sizeData.tileCount;

        metrics.totalStats.sizeData.isDeep |= metrics.stats[i].sizeData.isDeep;
        metrics.totalStats.sizeData.isTiled |=
            metrics.stats[i].sizeData.isTiled;

        //check for mixed compression or part types within file

        if (metrics.stats[i].sizeData.compression !=
            metrics.totalStats.sizeData.compression)
        {
            metrics.totalStats.sizeData.compression = NUM_COMPRESSION_METHODS;
        }
        if (metrics.stats[i].sizeData.partType !=
            metrics.totalStats.sizeData.partType)
        {
            metrics.totalStats.sizeData.partType = "";
        }
    }

    if (verbose) { cerr << endl; }
    return metrics;
}